

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execLea<(moira::Instr)67,(moira::Mode)10,(moira::Size)4>(Moira *this,u16 opcode)

{
  u32 uVar1;
  
  uVar1 = computeEA<(moira::Mode)10,(moira::Size)4,0ul>(this,opcode & 7);
  *(u32 *)((long)this->exec + (ulong)(opcode >> 9 & 7) * 4 + -0x38) = uVar1;
  (*this->_vptr_Moira[0x19])(this,2);
  prefetch<4ul>(this);
  return;
}

Assistant:

void
Moira::execLea(u16 opcode)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    reg.a[dst] = computeEA<M,S>(src);
    if (isIdxMode(M)) sync(2);

    prefetch<POLLIPL>();
}